

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

bool __thiscall PPointer::ReadValue(PPointer *this,FSerializer *ar,char *key,void *addr)

{
  bool bVar1;
  ulong in_RAX;
  bool res;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  bVar1 = DObject::IsKindOf((DObject *)this->PointedType,PClass::RegistrationInfo.MyClass);
  if (bVar1) {
    uStack_28 = uStack_28 & 0xffffffffffffff;
    ::Serialize(ar,key,(DObject **)addr,(DObject **)0x0,(bool *)((long)&uStack_28 + 7));
  }
  else {
    uStack_28._7_1_ = 0;
  }
  return (bool)uStack_28._7_1_;
}

Assistant:

bool PPointer::ReadValue(FSerializer &ar, const char *key, void *addr) const
{
	if (PointedType->IsKindOf(RUNTIME_CLASS(PClass)))
	{
		bool res = false;
		::Serialize(ar, key, *(DObject **)addr, nullptr, &res);
		return res;
	}
	return false;
}